

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O2

Reals __thiscall Omega_h::metric_from_gradients_dim<1>(Omega_h *this,Reals *gradients,Real eps)

{
  Alloc *pAVar1;
  void *extraout_RDX;
  LO size_in;
  size_t sVar2;
  Reals RVar3;
  Write<double> out;
  type f;
  allocator local_69;
  Write<double> local_68;
  Real local_58;
  Write<signed_char> local_50;
  undefined1 local_40 [24];
  Write<double> local_28;
  
  pAVar1 = (gradients->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar2 = pAVar1->size;
  }
  else {
    sVar2 = (ulong)pAVar1 >> 3;
  }
  local_58 = eps;
  std::__cxx11::string::string((string *)local_40,"",&local_69);
  size_in = (LO)(sVar2 >> 3);
  Write<double>::Write(&local_68,size_in,(string *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  Write<double>::Write((Write<double> *)local_40,&gradients->write_);
  local_40._16_8_ = local_58;
  Write<double>::Write(&local_28,&local_68);
  parallel_for<Omega_h::metric_from_gradients_dim<1>(Omega_h::Read<double>,double)::_lambda(int)_1_>
            (size_in,(type *)local_40,"metric_from_gradients");
  Write<double>::Write(&local_50,(Write<signed_char> *)&local_68);
  Read<double>::Read((Read<signed_char> *)this,(Write<double> *)&local_50);
  Write<double>::~Write((Write<double> *)&local_50);
  metric_from_gradients_dim<1>(Omega_h::Read<double>,double)::{lambda(int)#1}::~Read
            ((_lambda_int__1_ *)local_40);
  Write<double>::~Write(&local_68);
  RVar3.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar3.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar3.write_.shared_alloc_;
}

Assistant:

Reals metric_from_gradients_dim(Reals gradients, Real eps) {
  auto n = divide_no_remainder(gradients.size(), dim);
  auto out = Write<Real>(n * symm_ncomps(dim));
  auto f = OMEGA_H_LAMBDA(LO const i) {
    auto const grad = get_vector<dim>(gradients, i);
    auto const m = metric_from_gradient(grad, eps);
    set_symm(out, i, m);
  };
  parallel_for(n, f, "metric_from_gradients");
  return out;
}